

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

XmlWriter * __thiscall
Catch::XmlWriter::startElement(XmlWriter *this,string *name,XmlFormatting fmt)

{
  ostream *poVar1;
  
  ensureTagClosed(this);
  newlineIfNecessary(this);
  if ((fmt & Indent) != None) {
    std::operator<<((ostream *)this->m_os,(string *)&this->m_indent);
    std::__cxx11::string::append((char *)&this->m_indent);
  }
  poVar1 = std::operator<<((ostream *)this->m_os,'<');
  std::operator<<(poVar1,(string *)name);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_tags,name);
  this->m_tagIsOpen = true;
  this->m_needsNewline = (bool)((byte)fmt >> 1 & 1);
  return this;
}

Assistant:

XmlWriter& XmlWriter::startElement( std::string const& name, XmlFormatting fmt ) {
        ensureTagClosed();
        newlineIfNecessary();
        if (shouldIndent(fmt)) {
            m_os << m_indent;
            m_indent += "  ";
        }
        m_os << '<' << name;
        m_tags.push_back( name );
        m_tagIsOpen = true;
        applyFormatting(fmt);
        return *this;
    }